

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::protos::gen::HeapprofdConfig::~HeapprofdConfig(HeapprofdConfig *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false> _Var3;
  pointer puVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__HeapprofdConfig_003c75f0;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->continuous_dump_config_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
       .super__Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl != (HeapprofdConfig_ContinuousDumpConfig *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 8))();
  }
  (this->continuous_dump_config_).ptr_._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
  .super__Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false>.
  _M_head_impl = (HeapprofdConfig_ContinuousDumpConfig *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->skip_symbol_prefix_);
  puVar4 = (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->heap_sampling_intervals_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->exclude_heaps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->heaps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->target_installed_by_);
  puVar4 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->pid_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->process_cmdline_);
  return;
}

Assistant:

HeapprofdConfig::~HeapprofdConfig() = default;